

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O2

void __thiscall DFraggleThinker::Tick(DFraggleThinker *this)

{
  TObjPtr<DFsScript> *obj;
  TObjPtr<DRunningScript> *obj_00;
  TObjPtr<DRunningScript> *obj_01;
  bool bVar1;
  DRunningScript *script;
  DFsScript *pDVar2;
  DFsVariable *pointed;
  DRunningScript *pDVar3;
  DRunningScript *pDVar4;
  DFsScript *pDVar5;
  long lVar6;
  
  script = GC::ReadBarrier<DRunningScript>((DRunningScript **)&this->RunningScripts);
  do {
    script = GC::ReadBarrier<DRunningScript>((DRunningScript **)&script->next);
    while( true ) {
      if (script == (DRunningScript *)0x0) {
        return;
      }
      bVar1 = wait_finished(this,script);
      if (!bVar1) break;
      obj = &script->script;
      for (lVar6 = 0x40; pDVar2 = GC::ReadBarrier<DFsScript>((DFsScript **)obj), lVar6 != 0xc0;
          lVar6 = lVar6 + 8) {
        *(undefined8 *)((long)&pDVar2->sections[9].field_0 + lVar6) =
             *(undefined8 *)
              ((long)&(((DRunningScript *)(script->variables + -8))->super_DObject)._vptr_DObject +
              lVar6);
        pDVar2 = GC::ReadBarrier<DFsScript>((DFsScript **)obj);
        pointed = GC::ReadBarrier<DFsVariable>
                            ((DFsVariable **)
                             ((long)&(((DRunningScript *)(script->variables + -8))->super_DObject).
                                     _vptr_DObject + lVar6));
        GC::WriteBarrier(&pDVar2->super_DObject,&pointed->super_DObject);
        *(undefined8 *)
         ((long)&(((DRunningScript *)(script->variables + -8))->super_DObject)._vptr_DObject + lVar6
         ) = 0;
      }
      (pDVar2->trigger).field_0 = (script->trigger).field_0;
      obj_00 = &script->next;
      obj_01 = &script->prev;
      pDVar3 = GC::ReadBarrier<DRunningScript>((DRunningScript **)obj_01);
      (pDVar3->next).field_0 = (script->next).field_0;
      pDVar3 = GC::ReadBarrier<DRunningScript>((DRunningScript **)obj_01);
      pDVar4 = GC::ReadBarrier<DRunningScript>((DRunningScript **)obj_00);
      GC::WriteBarrier(&pDVar3->super_DObject,&pDVar4->super_DObject);
      pDVar3 = GC::ReadBarrier<DRunningScript>((DRunningScript **)obj_00);
      if (pDVar3 != (DRunningScript *)0x0) {
        pDVar3 = GC::ReadBarrier<DRunningScript>((DRunningScript **)obj_00);
        (pDVar3->prev).field_0 = obj_01->field_0;
        pDVar3 = GC::ReadBarrier<DRunningScript>((DRunningScript **)obj_00);
        pDVar4 = GC::ReadBarrier<DRunningScript>((DRunningScript **)obj_01);
        GC::WriteBarrier(&pDVar3->super_DObject,&pDVar4->super_DObject);
      }
      pDVar3 = GC::ReadBarrier<DRunningScript>((DRunningScript **)obj_00);
      pDVar2 = GC::ReadBarrier<DFsScript>((DFsScript **)obj);
      pDVar5 = GC::ReadBarrier<DFsScript>((DFsScript **)obj);
      DFsScript::ParseScript(pDVar2,pDVar5->data + script->save_point);
      (*(script->super_DObject)._vptr_DObject[4])(script);
      script = pDVar3;
    }
  } while( true );
}

Assistant:

void DFraggleThinker::Tick()
{
	DRunningScript *current, *next;
	int i;
	
	current = RunningScripts->next;
    
	while(current)
	{
		if(wait_finished(current))
		{
			// copy out the script variables from the
			// runningscript
			
			for(i=0; i<VARIABLESLOTS; i++)
			{
				current->script->variables[i] = current->variables[i];
				GC::WriteBarrier(current->script, current->variables[i]);
				current->variables[i] = NULL;
			}
			current->script->trigger = current->trigger; // copy trigger
			
			// unhook from chain 
			current->prev->next = current->next;
			GC::WriteBarrier(current->prev, current->next);
			if(current->next) 
			{
				current->next->prev = current->prev;
				GC::WriteBarrier(current->next, current->prev);
			}
			next = current->next;   // save before freeing
			
			// continue the script
			current->script->ParseScript (current->script->data + current->save_point);

			// free
			current->Destroy();
		}
		else
			next = current->next;
		current = next;   // continue to next in chain
	}
}